

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O2

void DitherCombine8x8_C(uint8_t *dither,uint8_t *dst,int dst_stride)

{
  int iVar1;
  long lVar2;
  uint8_t uVar3;
  int iVar4;
  
  for (iVar1 = 0; iVar1 != 8; iVar1 = iVar1 + 1) {
    for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
      iVar4 = (uint)dst[lVar2] + ((int)(dither[lVar2] - 0x78) >> 4);
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      uVar3 = (uint8_t)iVar4;
      if (0xfe < iVar4) {
        uVar3 = 0xff;
      }
      dst[lVar2] = uVar3;
    }
    dst = dst + dst_stride;
    dither = dither + 8;
  }
  return;
}

Assistant:

static void DitherCombine8x8_C(const uint8_t* WEBP_RESTRICT dither,
                               uint8_t* WEBP_RESTRICT dst, int dst_stride) {
  int i, j;
  for (j = 0; j < 8; ++j) {
    for (i = 0; i < 8; ++i) {
      const int delta0 = dither[i] - VP8_DITHER_AMP_CENTER;
      const int delta1 =
          (delta0 + VP8_DITHER_DESCALE_ROUNDER) >> VP8_DITHER_DESCALE;
      dst[i] = clip_8b((int)dst[i] + delta1);
    }
    dst += dst_stride;
    dither += 8;
  }
}